

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseFunctionOrStateVariable(StructuralParser *this)

{
  bool isExternal;
  bool bVar1;
  int iVar2;
  Identifier name;
  ModuleBase *pMVar3;
  undefined4 extraout_var;
  Expression *pEVar4;
  undefined4 extraout_var_00;
  pool_ptr<soul::AST::Expression> type;
  Context declarationContext;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  genericWildcards;
  Context context;
  undefined1 local_1a8 [32];
  _Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_188;
  Context local_168;
  Context local_150;
  _Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_138;
  _Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  local_120;
  CompileMessage local_108;
  CompileMessage local_d0;
  CompileMessage local_98;
  CompileMessage local_60;
  
  getContext((Context *)(local_1a8 + 8),this);
  isExternal = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
               ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297424);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,"static_assert");
  if (bVar1) {
    parseStaticAssert(this);
  }
  else {
    tryParsingType((StructuralParser *)local_1a8,(ParseTypeContext)this);
    if ((Expression *)local_1a8._0_8_ == (Expression *)0x0) {
      Errors::expectedFunctionOrVariable<>();
      AST::Context::throwError((Context *)(local_1a8 + 8),&local_60,false);
    }
    getContext(&local_168,this);
    name = parseIdentifier(this);
    local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275db3);
    if (bVar1) {
      parseGenericFunctionWildcardList
                ((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                  *)&local_120,this);
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::_M_move_assign((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                        *)&local_188,&local_120);
      std::
      _Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::~_Vector_base(&local_120);
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b537);
    if (bVar1) {
      if (isExternal) {
        Errors::functionCannotBeExternal<>();
        AST::Context::throwError((Context *)(local_1a8 + 8),&local_98,false);
      }
      pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
      iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[0xc])(pMVar3);
      if ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
           *)CONCAT44(extraout_var,iVar2) ==
          (vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
           *)0x0) {
        pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
        iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[5])(pMVar3);
        if ((char)iVar2 == '\0') {
          Errors::noFunctionInThisScope<>();
        }
        else {
          Errors::graphCannotContainFunctions<>();
        }
        AST::Context::throwError((Context *)(local_1a8 + 8),&local_108,false);
      }
      pEVar4 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)local_1a8);
      std::
      vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::vector((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                *)&local_138,
               (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                *)&local_188);
      local_120._M_impl.super__Vector_impl_data._M_start =
           (pointer)parseFunctionDeclaration
                              (this,(Context *)(local_1a8 + 8),pEVar4,name,&local_168,
                               (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                                *)&local_138);
      std::
      vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
      ::emplace_back<soul::pool_ref<soul::AST::Function>>
                ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
                  *)CONCAT44(extraout_var,iVar2),(pool_ref<soul::AST::Function> *)&local_120);
      std::
      _Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
      ::~_Vector_base(&local_138);
    }
    else {
      if (isExternal) {
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                           ((pool_ptr<soul::AST::Expression> *)local_1a8);
        iVar2 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[10])(pEVar4);
        if (iVar2 == 0) {
          Errors::noConstOnExternals<>();
          AST::Context::throwError((Context *)(local_1a8 + 8),&local_d0,false);
        }
      }
      pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
      iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[0xb])(pMVar3);
      pEVar4 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)local_1a8);
      AST::Context::Context(&local_150,&local_168);
      local_120._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar2);
      parseVariableDeclaration<soul::StructuralParser::parseFunctionOrStateVariable()::_lambda(soul::AST::VariableDeclaration&)_1_>
                (this,pEVar4,name,isExternal,&local_150,(anon_class_8_1_ee5ece24 *)&local_120);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)&local_150);
    }
    std::
    _Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ::~_Vector_base(&local_188);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_168);
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)(local_1a8 + 8));
  return;
}

Assistant:

void parseFunctionOrStateVariable()
    {
        auto declarationContext = getContext();
        bool isExternal = matchIf (Keyword::external);

        if (matches ("static_assert"))
            return parseStaticAssert();

        auto type = tryParsingType (ParseTypeContext::variableType);

        if (type == nullptr)
            declarationContext.throwError (Errors::expectedFunctionOrVariable());

        auto context = getContext();
        auto name = parseIdentifier();

        std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards;

        if (matchIf (Operator::lessThan))
            genericWildcards = parseGenericFunctionWildcardList();

        if (matchIf (Operator::openParen))
        {
            if (isExternal)
                declarationContext.throwError (Errors::functionCannotBeExternal());

            if (auto functions = module->getFunctionList())
                functions->push_back (parseFunctionDeclaration (declarationContext, *type, name, context, genericWildcards));
            else
                declarationContext.throwError (module->isGraph() ? Errors::graphCannotContainFunctions()
                                                                 : Errors::noFunctionInThisScope());
        }
        else
        {
            if (isExternal && type->getConstness() == AST::Constness::definitelyConst)
                declarationContext.throwError (Errors::noConstOnExternals());

            auto& stateVariables = module->getStateVariableList();

            parseVariableDeclaration (*type, name, isExternal, context,
                                      [&] (AST::VariableDeclaration& v)  { stateVariables.push_back (v); });
        }
    }